

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O0

cio_error cio_buffered_stream_read_until
                    (cio_buffered_stream *buffered_stream,cio_read_buffer *buffer,char *delim,
                    cio_buffered_stream_read_handler_t handler,void *handler_context)

{
  size_t sVar1;
  bool bVar2;
  void *handler_context_local;
  cio_buffered_stream_read_handler_t handler_local;
  char *delim_local;
  cio_read_buffer *buffer_local;
  cio_buffered_stream *buffered_stream_local;
  
  bVar2 = true;
  if (((buffered_stream != (cio_buffered_stream *)0x0) &&
      (bVar2 = true, buffer != (cio_read_buffer *)0x0)) &&
     (bVar2 = true, handler != (cio_buffered_stream_read_handler_t)0x0)) {
    bVar2 = delim == (char *)0x0;
  }
  if (bVar2) {
    buffered_stream_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    (buffered_stream->read_info).until.delim = delim;
    sVar1 = strlen(delim);
    (buffered_stream->read_info).until.delim_length = sVar1;
    buffered_stream->read_job = internal_read_until;
    buffered_stream->read_buffer = buffer;
    buffered_stream->read_handler = handler;
    buffered_stream->read_handler_context = handler_context;
    buffered_stream->last_error = CIO_SUCCESS;
    start_read(buffered_stream);
    buffered_stream_local._4_4_ = CIO_SUCCESS;
  }
  return buffered_stream_local._4_4_;
}

Assistant:

enum cio_error cio_buffered_stream_read_until(struct cio_buffered_stream *buffered_stream, struct cio_read_buffer *buffer, const char *delim, cio_buffered_stream_read_handler_t handler, void *handler_context)
{
	if (cio_unlikely((buffered_stream == NULL) || (buffer == NULL) || (handler == NULL) || (delim == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	buffered_stream->read_info.until.delim = delim;
	buffered_stream->read_info.until.delim_length = strlen(delim);
	buffered_stream->read_job = internal_read_until;
	buffered_stream->read_buffer = buffer;
	buffered_stream->read_handler = handler;
	buffered_stream->read_handler_context = handler_context;
	buffered_stream->last_error = CIO_SUCCESS;
	start_read(buffered_stream);

	return CIO_SUCCESS;
}